

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_traits.h
# Opt level: O1

size_t absl::lts_20250127::container_internal::
       hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_void>
       ::hash_slot_fn_non_type_erased<absl::lts_20250127::container_internal::StringHash>
                 (void *hash_fn,void *slot)

{
  uchar *bytes;
  uint64_t uVar1;
  ulong uVar2;
  uint64_t v;
  
  uVar2 = *(ulong *)((long)slot + 8);
  uVar1 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,*slot,uVar2);
  uVar2 = (uVar1 ^ uVar2) * -0x234dd359734ecb13;
  return uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
}

Assistant:

static constexpr auto soo_enabled_impl(Rank1) -> decltype(P::soo_enabled()) {
    return P::soo_enabled();
  }